

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::iterateDynamicsEuler
          (IMUElasticLocalFrameDynamicalSystem *this,Vector3 *positionCom,Vector3 *velocityCom,
          Vector3 *accelerationCom,Vector3 *AngMomentum,Vector3 *dotAngMomentum,Matrix3 *inertia,
          Matrix3 *dotInertia,IndexedMatrixArray *contactPos,IndexedMatrixArray *contactOri,
          Vector3 *position,Vector3 *linVelocity,Vector *fc,Vector3 *oriVector,Vector3 *angularVel,
          Vector *tc,Vector3 *fm,Vector3 *tm,Vector3 *addiForces,Vector3 *addiMoments,double dt)

{
  double *pdVar1;
  Matrix3 *mat;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  long lVar10;
  ActualDstType actualDst_3;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  SrcEvaluatorType srcEvaluator;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double adStackY_5d0 [136];
  undefined8 uStackY_190;
  Matrix3 *pMStackY_188;
  Matrix3 *pMStackY_180;
  IndexedMatrixArray *pIStackY_178;
  IndexedMatrixArray *pIStackY_170;
  Vector3 *pVStackY_168;
  Vector3 *pVStackY_160;
  Vector3 *pVStackY_158;
  Vector3 *pVStackY_150;
  Matrix3 *pMStackY_148;
  Vector3 *pVStackY_140;
  Vector3 *pVStackY_138;
  Vector *pVStackY_130;
  undefined1 local_f8 [16];
  undefined1 local_e8 [40];
  double dStack_c0;
  double dStack_b0;
  type tmp;
  
  dVar2 = (this->op_).orientationVector0.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  if ((((dVar2 == (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[0]) &&
       (!NAN(dVar2) &&
        !NAN((oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[0]))) &&
      (dVar2 = (this->op_).orientationVector0.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1],
      pdVar1 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array + 1, dVar2 == *pdVar1)) && (!NAN(dVar2) && !NAN(*pdVar1))) {
    dVar2 = (this->op_).orientationVector0.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    pdVar1 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array + 2;
    if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) goto LAB_00159024;
  }
  dVar2 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[1];
  (this->op_).orientationVector0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] =
       (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  (this->op_).orientationVector0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = dVar2;
  (this->op_).orientationVector0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[2] =
       (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  dVar11 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[0];
  dVar9 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[1];
  dVar2 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[2];
  dVar2 = dVar2 * dVar2 + dVar9 * dVar9 + dVar11 * dVar11;
  dVar11 = 1.0;
  if (dVar2 <= 9.999999999999999e-33) {
    local_e8._0_16_ = ZEXT816(0);
    dVar2 = 0.0;
  }
  else {
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    auVar12._8_8_ = dVar2;
    auVar12._0_8_ = dVar2;
    local_e8._0_16_ =
         divpd(*(undefined1 (*) [16])
                (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array,auVar12);
    dVar11 = (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2] / dVar2;
  }
  dVar9 = sin(dVar2);
  dVar14 = dVar9 * (double)local_e8._0_8_;
  auVar5._8_4_ = SUB84(dVar9 * (double)local_e8._8_8_,0);
  auVar5._0_8_ = dVar14;
  auVar5._12_4_ = (int)((ulong)(dVar9 * (double)local_e8._8_8_) >> 0x20);
  dVar2 = cos(dVar2);
  dVar16 = 1.0 - dVar2;
  dVar17 = dVar16 * (double)local_e8._0_8_;
  dStack_c0 = auVar5._8_8_;
  dVar15 = dVar11 * dVar16 * (double)local_e8._8_8_;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = (double)local_e8._0_8_ * dVar17 + dVar2;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = (double)local_e8._8_8_ * dVar17 + dVar11 * dVar9;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = dVar11 * dVar17 - dStack_c0;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = (double)local_e8._8_8_ * dVar17 - dVar11 * dVar9;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = dVar16 * (double)local_e8._8_8_ * (double)local_e8._8_8_ + dVar2;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] = dVar15 + dVar14;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[6] = dStack_c0 + dVar11 * dVar17;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[7] = dVar15 - dVar14;
  (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[8] = dVar11 * dVar16 * dVar11 + dVar2;
LAB_00159024:
  mat = &(this->op_).rFlex;
  dVar2 = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[1];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[0];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = dVar2;
  dVar2 = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[3];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[2];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = dVar2;
  dVar2 = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[5];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[4] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[4];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = dVar2;
  dVar2 = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[7];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[6] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[6];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[7] = dVar2;
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[8] = (this->op_).curRotation0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[8];
  pVStackY_158 = &(this->op_).linearAcceleration;
  pVStackY_138 = &(this->op_).angularAcceleration;
  pVStackY_130 = fc;
  pVStackY_140 = angularVel;
  pVStackY_150 = oriVector;
  pVStackY_160 = linVelocity;
  pVStackY_168 = position;
  pIStackY_170 = contactOri;
  pIStackY_178 = contactPos;
  pMStackY_180 = dotInertia;
  pMStackY_188 = inertia;
  uStackY_190 = 0x1590eb;
  pMStackY_148 = mat;
  (*(this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase[10])
            (this,positionCom,velocityCom,accelerationCom,AngMomentum,dotAngMomentum);
  dVar14 = dt * 0.5 * dt;
  dVar2 = (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1];
  dVar11 = (this->op_).linearAcceleration.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  dVar9 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0]
       = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
         array[0] +
         (this->op_).linearAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         .m_storage.m_data.array[0] * dVar14 +
         (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
         m_data.array[0] * dt;
  (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1]
       = dVar9 + dVar11 * dVar14 + dVar2 * dt;
  (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2]
       = (this->op_).linearAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         .m_storage.m_data.array[2] * dVar14 +
         (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
         m_data.array[2] * dt +
         (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
         array[2];
  dVar2 = (this->op_).linearAcceleration.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  dVar11 = (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[1];
  (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [0] = (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
        .array[0] +
        (this->op_).linearAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] * dt;
  (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [1] = dVar11 + dVar2 * dt;
  (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [2] = (this->op_).linearAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[2] * dt +
        (linVelocity->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
        .array[2];
  auVar13._0_8_ =
       (this->op_).angularAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0] * dVar14 +
       (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0] * dt;
  auVar13._8_8_ =
       (this->op_).angularAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1] * dVar14 +
       (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1] * dt;
  local_e8._0_8_ =
       dVar14 * (this->op_).angularAcceleration.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                [2] +
       (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2] * dt;
  dVar2 = (double)local_e8._0_8_ * (double)local_e8._0_8_ +
          auVar13._8_8_ * auVar13._8_8_ + auVar13._0_8_ * auVar13._0_8_;
  if (dVar2 <= 9.999999999999999e-33) {
    dVar2 = 0.0;
    local_f8 = ZEXT816(0);
    local_e8._0_8_ = 1.0;
  }
  else {
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    auVar6._8_4_ = SUB84(dVar2,0);
    auVar6._0_8_ = dVar2;
    auVar6._12_4_ = (int)((ulong)dVar2 >> 0x20);
    local_f8 = divpd(auVar13,auVar6);
    local_e8._0_8_ = (double)local_e8._0_8_ / dVar2;
  }
  dVar11 = sin(dVar2);
  dVar9 = dVar11 * (double)local_f8._0_8_;
  auVar7._8_4_ = SUB84(dVar11 * (double)local_f8._8_8_,0);
  auVar7._0_8_ = dVar9;
  auVar7._12_4_ = (int)((ulong)(dVar11 * (double)local_f8._8_8_) >> 0x20);
  dVar2 = cos(dVar2);
  dVar15 = 1.0 - dVar2;
  dVar16 = dVar15 * (double)local_f8._0_8_;
  dStack_b0 = auVar7._8_8_;
  dVar14 = (double)local_e8._0_8_ * dVar15 * (double)local_f8._8_8_;
  lVar10 = 0x558;
  do {
    dVar17 = *(double *)((long)this + lVar10 + -0x10);
    dVar3 = *(double *)((long)this + lVar10 + -8);
    dVar4 = *(double *)
             ((long)&(this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase +
             lVar10);
    *(double *)((long)adStackY_5d0 + lVar10) =
         dVar4 * (dStack_b0 + (double)local_e8._0_8_ * dVar16) +
         dVar3 * ((double)local_f8._8_8_ * dVar16 - (double)local_e8._0_8_ * dVar11) +
         dVar17 * ((double)local_f8._0_8_ * dVar16 + dVar2);
    *(double *)((long)adStackY_5d0 + lVar10 + 8) =
         dVar4 * (dVar14 - dVar9) +
         dVar3 * (dVar15 * (double)local_f8._8_8_ * (double)local_f8._8_8_ + dVar2) +
         dVar17 * ((double)local_f8._8_8_ * dVar16 + (double)local_e8._0_8_ * dVar11);
    *(double *)((long)adStackY_5d0 + lVar10 + 0x10) =
         dVar4 * ((double)local_e8._0_8_ * dVar15 * (double)local_e8._0_8_ + dVar2) +
         (dVar14 + dVar9) * dVar3 + ((double)local_e8._0_8_ * dVar16 - dStack_b0) * dVar17;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x5a0);
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [0];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [1];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [2];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [3];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[4] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [4];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [5];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[6] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [6];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[7] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [7];
  (this->op_).rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[8] = tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             [8];
  dVar2 = (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1] +
          dt * (this->op_).angularAcceleration.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1];
  auVar8._8_4_ = SUB84(dVar2,0);
  auVar8._0_8_ = (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                 m_storage.m_data.array[0] +
                 dt * (this->op_).angularAcceleration.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[0];
  auVar8._12_4_ = (int)((ulong)dVar2 >> 0x20);
  *(undefined1 (*) [16])
   (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       = auVar8;
  (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [2] = dt * (this->op_).angularAcceleration.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
        + (angularVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[2];
  Eigen::AngleAxis<double>::operator=
            (&(this->op_).orientationAA,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)mat);
  dVar2 = (this->op_).orientationAA.m_angle;
  dVar11 = (this->op_).orientationAA.m_axis.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [0] = dVar2 * (this->op_).orientationAA.m_axis.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                [0];
  (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [1] = dVar2 * dVar11;
  (oriVector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
  [2] = dVar2 * (this->op_).orientationAA.m_axis.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                [2];
  pVStackY_130 = (Vector *)0x1594e6;
  computeForcesAndMoments
            (this,contactPos,contactOri,&(this->op_).contactVelArray,&(this->op_).contactAngVelArray
             ,position,linVelocity,oriVector,mat,angularVel,fc,tc);
  return;
}

Assistant:

void IMUElasticLocalFrameDynamicalSystem::iterateDynamicsEuler
             (const Vector3& positionCom, const Vector3& velocityCom,
              const Vector3& accelerationCom, const Vector3& AngMomentum,
              const Vector3& dotAngMomentum,
              const Matrix3& inertia, const Matrix3& dotInertia,
              const IndexedMatrixArray& contactPos,
              const IndexedMatrixArray& contactOri,
              Vector3& position, Vector3& linVelocity, Vector& fc,
              Vector3 &oriVector, Vector3& angularVel, Vector& tc,
              const Vector3 & fm, const Vector3& tm, const Vector3 &addiForces,
              const Vector3 & addiMoments,
              double dt)
    {

        op_.rFlex = computeRotation_(oriVector,0);
        //compute new acceleration with the current flex position and velocity and input

//        computeForcesAndMoments (contactPos, contactOri, op_.contactVelArray, op_.contactAngVelArray,
//                          position, linVelocity, oriVector, op_.rFlex,
//                             angularVel, fc, tc);

        computeAccelerations (positionCom, velocityCom,
        accelerationCom, AngMomentum, dotAngMomentum,
        inertia, dotInertia,  contactPos, contactOri, position, linVelocity, op_.linearAcceleration,
                       oriVector, op_.rFlex, angularVel, op_.angularAcceleration,
                       fc, tc, fm,tm, addiForces, addiMoments);

        //integrate kinematics with the last acceleration
        integrateKinematics(position, linVelocity, op_.linearAcceleration,
            op_.rFlex,angularVel, op_.angularAcceleration, dt);

        op_.orientationAA=op_.rFlex;
        oriVector.noalias()=op_.orientationAA.angle()*op_.orientationAA.axis();

        computeForcesAndMoments (contactPos, contactOri, op_.contactVelArray, op_.contactAngVelArray,
                          position, linVelocity, oriVector, op_.rFlex,
                             angularVel, fc, tc);
    }